

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O1

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitCallIndirect(InternalAnalyzer *this,CallIndirect *curr)

{
  CallIndirect CVar1;
  EffectAnalyzer *pEVar2;
  
  pEVar2 = this->parent;
  pEVar2->calls = true;
  CVar1 = curr[0x50];
  if ((CVar1 == (CallIndirect)0x1) &&
     (pEVar2->branchesOut = true, ((pEVar2->features).features & 0x40) != 0)) {
    pEVar2->hasReturnCallThrow = true;
  }
  if ((((pEVar2->features).features & 0x40) != 0) &&
     (pEVar2->tryDepth == 0 && CVar1 == (CallIndirect)0x0)) {
    pEVar2->throws_ = true;
  }
  return;
}

Assistant:

void visitCallIndirect(CallIndirect* curr) {
      parent.calls = true;
      if (curr->isReturn) {
        parent.branchesOut = true;
        if (parent.features.hasExceptionHandling()) {
          parent.hasReturnCallThrow = true;
        }
      }
      if (parent.features.hasExceptionHandling() &&
          (parent.tryDepth == 0 && !curr->isReturn)) {
        parent.throws_ = true;
      }
    }